

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoopThreadPool.cpp
# Opt level: O1

vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_> * __thiscall
sznet::net::KcpTcpEventLoopThreadPool::getAllLoops
          (vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
           *__return_storage_ptr__,KcpTcpEventLoopThreadPool *this)

{
  KcpTcpEventLoop *this_00;
  bool bVar1;
  pointer ppKVar2;
  
  this_00 = this->m_baseLoop;
  bVar1 = EventLoop::isInLoopThread(&this_00->super_EventLoop);
  if (!bVar1) {
    EventLoop::abortNotInLoopThread(&this_00->super_EventLoop);
  }
  if (this->m_started != false) {
    if ((this->m_loops).
        super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->m_loops).
        super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->
      super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppKVar2 = (pointer)operator_new(8);
      (__return_storage_ptr__->
      super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
      )._M_impl.super__Vector_impl_data._M_start = ppKVar2;
      (__return_storage_ptr__->
      super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppKVar2;
      (__return_storage_ptr__->
      super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = ppKVar2 + 1;
      *ppKVar2 = this->m_baseLoop;
      (__return_storage_ptr__->
      super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppKVar2 + 1;
    }
    else {
      std::vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>::
      vector(__return_storage_ptr__,&this->m_loops);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("m_started",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoopThreadPool.cpp"
                ,0x5b,
                "std::vector<KcpTcpEventLoop *> sznet::net::KcpTcpEventLoopThreadPool::getAllLoops()"
               );
}

Assistant:

std::vector<KcpTcpEventLoop*> KcpTcpEventLoopThreadPool::getAllLoops()
{
	m_baseLoop->assertInLoopThread();
	assert(m_started);
	if (m_loops.empty())
	{
		return std::vector<KcpTcpEventLoop*>(1, m_baseLoop);
	}
	else
	{
		return m_loops;
	}
}